

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5ExprGetToken(Fts5Parse *pParse,char **pz,Fts5Token *pToken)

{
  char cVar1;
  int iVar2;
  int iVar3;
  char *local_48;
  char *z2_1;
  char *z2;
  char *pcStack_30;
  int tok;
  char *z;
  Fts5Token *pToken_local;
  char **pz_local;
  Fts5Parse *pParse_local;
  
  pcStack_30 = *pz;
  while (iVar2 = fts5ExprIsspace(*pcStack_30), iVar2 != 0) {
    pcStack_30 = pcStack_30 + 1;
  }
  pToken->p = pcStack_30;
  pToken->n = 1;
  cVar1 = *pcStack_30;
  if (cVar1 == '\0') {
    z2._4_4_ = 0;
  }
  else {
    iVar2 = (int)pcStack_30;
    if (cVar1 == '\"') {
      z2._4_4_ = 9;
      while ((z2_1 = pcStack_30 + 1, *z2_1 != '\"' || (z2_1 = pcStack_30 + 2, *z2_1 == '\"'))) {
        pcStack_30 = z2_1;
        if (*z2_1 == '\0') {
          sqlite3Fts5ParseError(pParse,"unterminated string");
          return 0;
        }
      }
      pToken->n = (int)z2_1 - iVar2;
    }
    else if (cVar1 == '(') {
      z2._4_4_ = 10;
    }
    else if (cVar1 == ')') {
      z2._4_4_ = 0xb;
    }
    else if (cVar1 == '*') {
      z2._4_4_ = 0xf;
    }
    else if (cVar1 == '+') {
      z2._4_4_ = 0xe;
    }
    else if (cVar1 == ',') {
      z2._4_4_ = 0xd;
    }
    else if (cVar1 == '-') {
      z2._4_4_ = 6;
    }
    else if (cVar1 == ':') {
      z2._4_4_ = 5;
    }
    else if (cVar1 == '^') {
      z2._4_4_ = 0xc;
    }
    else if (cVar1 == '{') {
      z2._4_4_ = 7;
    }
    else if (cVar1 == '}') {
      z2._4_4_ = 8;
    }
    else {
      iVar3 = sqlite3Fts5IsBareword(*pcStack_30);
      if (iVar3 == 0) {
        sqlite3Fts5ParseError(pParse,"fts5: syntax error near \"%.1s\"",pcStack_30);
        return 0;
      }
      z2._4_4_ = 9;
      do {
        local_48 = pcStack_30 + 1;
        iVar3 = sqlite3Fts5IsBareword(*local_48);
        pcStack_30 = local_48;
      } while (iVar3 != 0);
      pToken->n = (int)local_48 - iVar2;
      if ((pToken->n == 2) && (*(short *)pToken->p == 0x524f)) {
        z2._4_4_ = 1;
      }
      if ((pToken->n == 3) && (iVar2 = memcmp(pToken->p,"NOT",3), iVar2 == 0)) {
        z2._4_4_ = 3;
      }
      if ((pToken->n == 3) && (iVar2 = memcmp(pToken->p,"AND",3), iVar2 == 0)) {
        z2._4_4_ = 2;
      }
    }
  }
  *pz = pToken->p + pToken->n;
  return z2._4_4_;
}

Assistant:

static int fts5ExprGetToken(
  Fts5Parse *pParse, 
  const char **pz,                /* IN/OUT: Pointer into buffer */
  Fts5Token *pToken
){
  const char *z = *pz;
  int tok;

  /* Skip past any whitespace */
  while( fts5ExprIsspace(*z) ) z++;

  pToken->p = z;
  pToken->n = 1;
  switch( *z ){
    case '(':  tok = FTS5_LP;    break;
    case ')':  tok = FTS5_RP;    break;
    case '{':  tok = FTS5_LCP;   break;
    case '}':  tok = FTS5_RCP;   break;
    case ':':  tok = FTS5_COLON; break;
    case ',':  tok = FTS5_COMMA; break;
    case '+':  tok = FTS5_PLUS;  break;
    case '*':  tok = FTS5_STAR;  break;
    case '-':  tok = FTS5_MINUS; break;
    case '^':  tok = FTS5_CARET; break;
    case '\0': tok = FTS5_EOF;   break;

    case '"': {
      const char *z2;
      tok = FTS5_STRING;

      for(z2=&z[1]; 1; z2++){
        if( z2[0]=='"' ){
          z2++;
          if( z2[0]!='"' ) break;
        }
        if( z2[0]=='\0' ){
          sqlite3Fts5ParseError(pParse, "unterminated string");
          return FTS5_EOF;
        }
      }
      pToken->n = (z2 - z);
      break;
    }

    default: {
      const char *z2;
      if( sqlite3Fts5IsBareword(z[0])==0 ){
        sqlite3Fts5ParseError(pParse, "fts5: syntax error near \"%.1s\"", z);
        return FTS5_EOF;
      }
      tok = FTS5_STRING;
      for(z2=&z[1]; sqlite3Fts5IsBareword(*z2); z2++);
      pToken->n = (z2 - z);
      if( pToken->n==2 && memcmp(pToken->p, "OR", 2)==0 )  tok = FTS5_OR;
      if( pToken->n==3 && memcmp(pToken->p, "NOT", 3)==0 ) tok = FTS5_NOT;
      if( pToken->n==3 && memcmp(pToken->p, "AND", 3)==0 ) tok = FTS5_AND;
      break;
    }
  }

  *pz = &pToken->p[pToken->n];
  return tok;
}